

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunLicense(undefined8 param_1,undefined2 param_2,undefined8 param_3,string *param_4)

{
  int iVar1;
  ostream *poVar2;
  string local_288 [32];
  stringstream local_268 [8];
  stringstream stream;
  ostream local_258 [376];
  undefined4 local_e0;
  string local_d0 [32];
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  undefined2 uStack_8a;
  LicenseAccess local_80 [8];
  LicenseAccess device;
  Commandline *args_local;
  string *gw_local;
  uint16_t port_local;
  AmsNetId netid_local;
  
  bhf::ads::LicenseAccess::LicenseAccess(local_80,param_3,CONCAT26(uStack_8a,(int6)param_1),param_2)
  ;
  std::__cxx11::string::string(local_d0);
  bhf::Commandline::Pop<std::__cxx11::string>((Commandline *)local_b0,param_4);
  std::__cxx11::string::~string(local_d0);
  iVar1 = std::__cxx11::string::compare(local_b0);
  if (iVar1 == 0) {
    _port_local = bhf::ads::LicenseAccess::ShowOnlineInfo((ostream *)local_80);
  }
  else {
    iVar1 = std::__cxx11::string::compare(local_b0);
    if (iVar1 == 0) {
      _port_local = bhf::ads::LicenseAccess::ShowPlatformId((ostream *)local_80);
    }
    else {
      iVar1 = std::__cxx11::string::compare(local_b0);
      if (iVar1 == 0) {
        _port_local = bhf::ads::LicenseAccess::ShowSystemId((ostream *)local_80);
      }
      else {
        iVar1 = std::__cxx11::string::compare(local_b0);
        if (iVar1 == 0) {
          _port_local = bhf::ads::LicenseAccess::ShowVolumeNo((ostream *)local_80);
        }
        else {
          std::__cxx11::stringstream::stringstream(local_268);
          poVar2 = std::operator<<(local_258,"RunLicense");
          poVar2 = std::operator<<(poVar2,"(): Unknown license command \'");
          poVar2 = std::operator<<(poVar2,(string *)local_b0);
          std::operator<<(poVar2,"\'\n");
          std::__cxx11::stringstream::str();
          Logger::Log(3,local_288);
          std::__cxx11::string::~string(local_288);
          std::__cxx11::stringstream::~stringstream(local_268);
          _port_local = -1;
        }
      }
    }
  }
  local_e0 = 1;
  std::__cxx11::string::~string((string *)local_b0);
  bhf::ads::LicenseAccess::~LicenseAccess(local_80);
  return _port_local;
}

Assistant:

int RunLicense(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::LicenseAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>();

    if (!command.compare("onlineinfo")) {
        return device.ShowOnlineInfo(std::cout);
    } else if (!command.compare("platformid")) {
        return device.ShowPlatformId(std::cout);
    } else if (!command.compare("systemid")) {
        return device.ShowSystemId(std::cout);
    } else if (!command.compare("volumeno")) {
        return device.ShowVolumeNo(std::cout);
    } else {
        LOG_ERROR(__FUNCTION__ << "(): Unknown license command '" << command << "'\n");
        return -1;
    }
}